

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void writeentry(int fd,toptenentry *tt)

{
  uint uVar1;
  uint uVar2;
  boolean bVar3;
  size_t sVar4;
  ssize_t sVar5;
  undefined8 in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  undefined8 in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *local_490;
  char local_448 [4];
  int len;
  char buf [1024];
  toptenentry *tt_local;
  int fd_local;
  
  iVar6 = tt->maxhp;
  iVar7 = tt->deaths;
  iVar8 = tt->deathdate;
  iVar9 = tt->birthdate;
  iVar10 = tt->uid;
  snprintf(local_448,0x400,"%d.%d.%d %d %d %d %d %d %d %d %d %d %d ",(ulong)(uint)tt->ver_major,
           (ulong)(uint)tt->ver_minor,(ulong)(uint)tt->patchlevel,
           CONCAT44((int)((ulong)in_stack_fffffffffffffb18 >> 0x20),tt->points),
           CONCAT44((int)((ulong)in_stack_fffffffffffffb20 >> 0x20),tt->deathdnum),
           CONCAT44((int)((ulong)in_stack_fffffffffffffb28 >> 0x20),tt->deathlev),
           CONCAT44((int)((ulong)in_stack_fffffffffffffb30 >> 0x20),tt->maxlvl),
           CONCAT44((int)((ulong)in_stack_fffffffffffffb38 >> 0x20),tt->hp),iVar6,iVar7,iVar8,iVar9,
           iVar10);
  sVar4 = strlen(local_448);
  sVar5 = write(fd,local_448,(long)(int)sVar4);
  if (sVar5 != (int)sVar4) {
    panic("Failed to write topten. Out of disk?");
  }
  uVar1 = tt->moves;
  uVar2 = tt->how;
  bVar3 = onlyspace(tt->name);
  if (bVar3 == '\0') {
    local_490 = tt->name;
  }
  else {
    local_490 = "_";
  }
  snprintf(local_448,0x400,"%d %d %s %s %s %s %s,%s\n",(ulong)uVar1,(ulong)uVar2,tt->plrole,
           tt->plrace,tt->plgend,tt->plalign,local_490,tt->death,iVar6,iVar7,iVar8,iVar9,iVar10);
  sVar4 = strlen(local_448);
  sVar5 = write(fd,local_448,(long)(int)sVar4);
  if (sVar5 != (int)sVar4) {
    panic("Failed to write topten. Out of disk?");
  }
  return;
}

Assistant:

static void writeentry(int fd, const struct toptenentry *tt)
{
    char buf[1024];
    int len;
    
    snprintf(buf, 1024, "%d.%d.%d %d %d %d %d %d %d %d %d %d %d ",
	     tt->ver_major, tt->ver_minor, tt->patchlevel,
	     tt->points, tt->deathdnum, tt->deathlev,
	     tt->maxlvl, tt->hp, tt->maxhp, tt->deaths,
	     tt->deathdate, tt->birthdate, tt->uid);
    len = strlen(buf);
    if (write(fd, buf, len) != len) panic("Failed to write topten. Out of disk?");
    
    snprintf(buf, 1024, "%d %d %s %s %s %s %s,%s\n",
	    tt->moves, tt->how, tt->plrole, tt->plrace, tt->plgend, tt->plalign,
	    onlyspace(tt->name) ? "_" : tt->name, tt->death);
    len = strlen(buf);
    if (write(fd, buf, len) != len) panic("Failed to write topten. Out of disk?");
}